

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O1

void Llb_ImgQuantifyFirst(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,Vec_Ptr_t *vQuant0,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *n;
  long lVar5;
  int level;
  DdNode *pDVar6;
  DdManager *unique;
  ulong uVar7;
  timespec ts;
  long local_58;
  timespec local_50;
  Vec_Ptr_t *local_40;
  Aig_Man_t *local_38;
  
  local_38 = pAig;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (0 < vDdMans->nSize) {
    uVar7 = 0;
    local_40 = vQuant0;
    do {
      unique = (DdManager *)vDdMans->pArray[uVar7];
      if (unique->bFunc2 != (DdNode *)0x0) {
        __assert_fail("dd->bFunc2 == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                      ,0x129,"void Llb_ImgQuantifyFirst(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int)"
                     );
      }
      unique->bFunc2 = unique->bFunc;
      Cudd_Ref(unique->bFunc);
      Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
      pDVar6 = unique->bFunc;
      if (fVerbose != 0) {
        pDVar4 = pDVar6;
        uVar3 = Cudd_DagSize(pDVar6);
        Abc_Print((int)pDVar4,"Part %2d : Init =%5d. ",uVar7 & 0xffffffff,(ulong)uVar3);
      }
      uVar1 = uVar7 + 1;
      if ((long)vQuant0->nSize <= (long)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pDVar4 = Llb_ImgComputeCube(local_38,(Vec_Int_t *)vQuant0->pArray[uVar7 + 1],unique);
      Cudd_Ref(pDVar4);
      n = Cudd_bddExistAbstract(unique,pDVar6,pDVar4);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(unique,pDVar6);
      Cudd_RecursiveDeref(unique,pDVar4);
      unique->bFunc = n;
      Cudd_AutodynDisable(unique);
      if (fVerbose == 0) {
        Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
      }
      else {
        pDVar6 = n;
        uVar3 = Cudd_DagSize(n);
        Abc_Print((int)pDVar6,"Quant =%5d. ",(ulong)uVar3);
        Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
        pDVar6 = n;
        uVar3 = Cudd_DagSize(n);
        Abc_Print((int)pDVar6,"Reo = %5d. ",(ulong)uVar3);
      }
      Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,100);
      vQuant0 = local_40;
      if (fVerbose != 0) {
        pDVar6 = n;
        uVar3 = Cudd_DagSize(n);
        Abc_Print((int)pDVar6,"Reo = %5d.  ",(ulong)uVar3);
        uVar3 = Cudd_SupportSize(unique,n);
        Abc_Print((int)unique,"Supp = %3d.  ",(ulong)uVar3);
        level = 3;
        iVar2 = clock_gettime(3,&local_50);
        if (iVar2 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + local_58) / 1000000.0);
      }
      uVar7 = uVar1;
    } while ((long)uVar1 < (long)vDdMans->nSize);
  }
  return;
}

Assistant:

void Llb_ImgQuantifyFirst( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, Vec_Ptr_t * vQuant0, int fVerbose )
{
    DdManager * dd;
    DdNode * bProd, * bRes, * bTemp;
    int i;
    abctime clk = Abc_Clock();
    Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
    {
        // remember unquantified ones
        assert( dd->bFunc2 == NULL );
        dd->bFunc2 = dd->bFunc;   Cudd_Ref( dd->bFunc2 );

        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

        bRes = dd->bFunc;
        if ( fVerbose )
            Abc_Print( 1, "Part %2d : Init =%5d. ", i, Cudd_DagSize(bRes) );
        bProd = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, i+1), dd );   Cudd_Ref( bProd );
        bRes  = Cudd_bddExistAbstract( dd, bTemp = bRes, bProd );                          Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
        dd->bFunc = bRes;

        Cudd_AutodynDisable( dd );

        if ( fVerbose )
            Abc_Print( 1, "Quant =%5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d. ", Cudd_DagSize(bRes) );
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose ) 
            Abc_Print( 1, "Reo = %5d.  ", Cudd_DagSize(bRes) );
        if ( fVerbose ) 
            Abc_Print( 1, "Supp = %3d.  ", Cudd_SupportSize(dd, bRes) );
        if ( fVerbose ) 
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    }
}